

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_json_to_str(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                  JSValue indent)

{
  JSValue *pJVar1;
  short sVar2;
  int iVar3;
  int *piVar4;
  JSValue indent_00;
  JSValue indent_01;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  uint uVar8;
  JSRefCountHeader *p_2;
  JSValueUnion JVar9;
  JSValueUnion JVar10;
  void *pvVar11;
  JSValueUnion JVar12;
  uint uVar13;
  JSValueUnion JVar14;
  int64_t iVar15;
  JSValueUnion JVar16;
  JSRefCountHeader *p_15;
  ulong uVar17;
  JSRuntime *rt;
  JSRefCountHeader *p_14;
  JSRefCountHeader *p;
  JSRefCountHeader *p_8;
  JSValue val_00;
  JSValue JVar18;
  JSValue v;
  JSValue v_00;
  JSValue JVar19;
  JSValue JVar20;
  JSValue JVar21;
  JSValue holder_00;
  JSValue JVar22;
  JSRefCountHeader *p_3;
  JSRefCountHeader *p_12;
  JSRefCountHeader *p_4;
  JSRefCountHeader *p_9;
  JSRefCountHeader *p_7;
  int64_t len;
  JSValueUnion JVar23;
  JSValueUnion local_e0;
  uint local_d0;
  uint local_c8;
  JSValueUnion local_c0;
  JSValueUnion local_b8;
  JSValueUnion local_b0;
  uint local_a0;
  uint32_t local_94;
  JSValueUnion local_90;
  int64_t iStack_88;
  StringBuffer **local_68;
  JSValueUnion local_60;
  void *local_50;
  undefined1 local_48 [16];
  void *local_38;
  
  JVar12 = (JSValueUnion)holder.tag;
  JVar14 = holder.u;
  local_90.ptr = (void *)(local_90 << 0x20);
  iStack_88 = 3;
  uVar8 = (uint)holder.tag;
  local_48 = (undefined1  [16])holder;
  switch(uVar8) {
  case 7:
    if (0x7fefffffffffffff < ((ulong)JVar14.ptr & 0x7fffffffffffffff)) {
      local_48._4_12_ = holder._4_12_;
      auVar5._12_4_ = 0;
      auVar5._0_12_ = local_48._4_12_;
      local_48 = auVar5 << 0x20;
      holder.tag = 2;
      holder.u = (JSValueUnion)local_48._0_8_;
    }
  case 0:
  case 1:
  case 2:
switchD_0012cecb_caseD_0:
    iVar7 = string_buffer_concat_value_free(jsc->b,holder);
    return iVar7;
  case 0xfffffff9:
    holder = JS_ToQuotedStringFree(ctx,holder);
LAB_0012cf3e:
    iVar7 = (int)holder.tag;
joined_r0x0012d101:
    if (iVar7 != 6) goto switchD_0012cecb_caseD_0;
LAB_0012cf5f:
    JVar18 = (JSValue)(ZEXT816(3) << 0x40);
    _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
    v_00 = (JSValue)(ZEXT816(3) << 0x40);
    v = (JSValue)(ZEXT816(3) << 0x40);
    break;
  default:
    iVar7 = 0;
    if (uVar8 < 0xfffffff5) {
      return 0;
    }
LAB_0012d11f:
    iVar3 = *JVar14.ptr;
    *(int *)JVar14.ptr = iVar3 + -1;
    if (1 < iVar3) {
      return iVar7;
    }
    rt = ctx->rt;
    goto LAB_0012d137;
  case 0xffffffff:
    sVar2 = *(short *)((long)JVar14.ptr + 6);
    if (sVar2 == 4) {
      holder = JS_ToNumberHintFree(ctx,holder,0x18dafc);
      goto LAB_0012cf3e;
    }
    if (sVar2 == 6) {
      iVar7 = string_buffer_concat_value(jsc->b,*(JSValue *)((long)JVar14.ptr + 0x30));
      goto LAB_0012d11f;
    }
    if (sVar2 == 5) {
      holder = JS_ToStringFree(ctx,holder);
      if ((int)holder.tag == 6) goto LAB_0012cf5f;
      holder = JS_ToQuotedStringFree(ctx,holder);
      iVar7 = (int)holder.tag;
      goto joined_r0x0012d101;
    }
    JVar18 = js_array_includes(ctx,jsc->stack,1,(JSValue *)local_48);
    if ((int)JVar18.tag == 6) goto LAB_0012cf5f;
    iVar7 = JS_ToBoolFree(ctx,JVar18);
    if (iVar7 == 0) {
      if (0xfffffff4 < (uint)val.tag) {
        *(int *)val.u.ptr = *val.u.ptr + 1;
      }
      piVar4 = (int *)(jsc->gap).u.ptr;
      JVar18 = jsc->gap;
      if (0xfffffff4 < (uint)(jsc->gap).tag) {
        *piVar4 = *piVar4 + 1;
      }
      JVar18 = JS_ConcatString(ctx,val,JVar18);
      JVar9 = JVar18.u;
      uVar13 = (uint)JVar18.tag;
      if (uVar13 == 6) goto LAB_0012d235;
      if (((int)(jsc->gap).tag == -7) && ((*(uint *)((long)(jsc->gap).u.ptr + 4) & 0x7fffffff) == 0)
         ) {
        pJVar1 = &jsc->empty;
        v = *pJVar1;
        v_00 = *pJVar1;
        JVar21 = *pJVar1;
        JVar19 = *pJVar1;
        if (0xfffffff4 < (uint)(jsc->empty).tag) {
          *(int *)(pJVar1->u).ptr = *(pJVar1->u).ptr + 1;
          pJVar1 = &jsc->empty;
          JVar20 = *pJVar1;
          v_00 = *pJVar1;
          v = JVar19;
          if (0xfffffff4 < (uint)(jsc->empty).tag) {
            *(int *)(pJVar1->u).ptr = *(pJVar1->u).ptr + 1;
            v_00 = JVar20;
            v = JVar21;
          }
        }
LAB_0012d334:
        local_e0 = v.u;
        local_c0 = v_00.u;
        JVar10.ptr = local_48;
        iVar15 = 0;
        JVar19 = js_array_push(ctx,jsc->stack,1,(JSValue *)JVar10.ptr,0);
        iVar7 = check_exception_free(ctx,JVar19);
        if (iVar7 == 0) {
          if (uVar8 == 0xffffffff) {
            if (*(short *)((long)JVar14.ptr + 6) == 0x29) {
              uVar8 = js_proxy_isArray(ctx,holder);
              if ((int)uVar8 < 0) goto LAB_0012d2da;
            }
            else {
              uVar8 = (uint)(*(short *)((long)JVar14.ptr + 6) == 2);
            }
            if (uVar8 == 0) goto LAB_0012d3e1;
            iVar7 = js_get_length64(ctx,(int64_t *)&local_50,holder);
            if (iVar7 != 0) goto LAB_0012d2da;
            string_buffer_putc8(jsc->b,0x5b);
            JVar22.tag = iVar15;
            JVar22.u.float64 = JVar10.float64;
            local_94 = 0x5d;
            if ((long)local_50 < 1) {
LAB_0012d8ca:
              JVar20.tag = (int64_t)JVar22.u.ptr;
              JVar20.u = (JSValueUnion)(JSValueUnion)JVar22.tag;
              _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
            }
            else {
              JVar10.float64 = 0.0;
              do {
                if (JVar10.ptr != (void *)0x0) {
                  string_buffer_putc8(jsc->b,0x2c);
                }
                string_buffer_concat_value(jsc->b,v);
                JVar19 = JS_GetPropertyInt64(ctx,holder,(int64_t)JVar10);
                if ((int)JVar19.tag == 6) goto LAB_0012d363;
                JVar12.float64 = (double)JVar10.float64;
                if (JVar10.ptr < (void *)0x80000000) {
                  JVar12 = JVar10;
                }
                iVar15 = 7;
                if (JVar10.ptr < (void *)0x80000000) {
                  iVar15 = 0;
                }
                val_00.tag = iVar15;
                val_00.u.float64 = JVar12.float64;
                JVar21 = JS_ToStringFree(ctx,val_00);
                _local_90 = JVar21;
                if ((uint)JVar21.tag == 6) goto LAB_0012d363;
                local_90 = JVar21.u;
                iStack_88 = JVar21.tag;
                JVar23 = local_90;
                JVar19 = js_json_check(ctx,jsc,holder,JVar19,JVar21);
                iVar15 = iStack_88;
                if ((0xfffffff4 < (uint)JVar21.tag) &&
                   (iVar7 = *local_90.ptr, *(int *)local_90.ptr = iVar7 + -1, iVar7 < 2)) {
                  __JS_FreeValueRT(ctx->rt,JVar21);
                  iVar15 = iStack_88;
                }
                local_90.ptr = (void *)(JVar21._4_8_ << 0x20);
                iStack_88 = 3;
                uVar17 = JVar19.tag & 0xffffffff;
                if (uVar17 == 6) goto LAB_0012d363;
                JVar16.float64 = 0.0;
                if (uVar17 != 3) {
                  JVar16 = JVar19.u;
                }
                JVar12.float64 = 9.88131291682493e-324;
                if ((int)JVar19.tag != 3) {
                  JVar12 = (JSValueUnion)JVar19.tag;
                }
                indent_01.tag = iVar15;
                indent_01.u.ptr = JVar23.ptr;
                holder_00.tag = (int64_t)JVar12.ptr;
                holder_00.u.float64 = JVar16.float64;
                JVar22 = JVar18;
                iVar7 = js_json_to_str(ctx,jsc,holder_00,JVar18,indent_01);
                if (iVar7 != 0) goto LAB_0012d363;
                JVar10.float64 = JVar10.float64 + 1;
              } while (local_50 != JVar10.ptr);
              if ((long)local_50 < 1) goto LAB_0012d8ca;
              if ((int)(jsc->gap).tag == -7) {
                pvVar11 = (jsc->gap).u.ptr;
                JVar12.float64 = 1.48219693752374e-323;
                local_94 = 0x5d;
                _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
                goto LAB_0012d8f2;
              }
              local_94 = 0x5d;
              _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0012d918:
              local_68 = &jsc->b;
              string_buffer_putc8(*local_68,10);
              string_buffer_concat_value(*local_68,val);
              JVar20.tag = (int64_t)JVar22.u.ptr;
              JVar20.u = (JSValueUnion)(JSValueUnion)JVar22.tag;
            }
LAB_0012d93b:
            iVar7 = JVar12.int32;
            string_buffer_putc8(jsc->b,local_94);
            JVar19 = js_array_pop(ctx,jsc->stack,iVar7,(JSValue *)JVar20.tag,0);
            iVar7 = check_exception_free(ctx,JVar19);
            JVar19 = _local_90;
            if (iVar7 == 0) {
              iVar7 = *JVar14.ptr;
              *(int *)JVar14.ptr = iVar7 + -1;
              if (iVar7 < 2) {
                __JS_FreeValueRT(ctx->rt,holder);
              }
              if (0xfffffff4 < (uint)local_b0._0_4_) {
                iVar7 = *local_b8.ptr;
                *(int *)local_b8.ptr = iVar7 + -1;
                if (iVar7 < 2) {
                  __JS_FreeValueRT(ctx->rt,_local_b8);
                }
              }
              local_d0 = (uint)v.tag;
              if ((0xfffffff4 < local_d0) &&
                 (iVar7 = *local_e0.ptr, *(int *)local_e0.ptr = iVar7 + -1, iVar7 < 2)) {
                __JS_FreeValueRT(ctx->rt,v);
              }
              local_c8 = (uint)v_00.tag;
              if ((0xfffffff4 < local_c8) &&
                 (iVar7 = *local_c0.ptr, *(int *)local_c0.ptr = iVar7 + -1, iVar7 < 2)) {
                __JS_FreeValueRT(ctx->rt,v_00);
              }
              if ((0xfffffff4 < uVar13) &&
                 (iVar7 = *JVar9.ptr, *(int *)JVar9.ptr = iVar7 + -1, iVar7 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar18);
              }
              iVar7 = 0;
              if (local_90._8_4_ < 0xfffffff5) {
                return 0;
              }
              iVar3 = *local_90.ptr;
              *(int *)local_90.ptr = iVar3 + -1;
              if (1 < iVar3) {
                return 0;
              }
              rt = ctx->rt;
              holder = _local_90;
              goto LAB_0012d137;
            }
LAB_0012d974:
            _local_90 = JVar19;
          }
          else {
LAB_0012d3e1:
            iVar15 = (jsc->property_list).tag;
            if ((uint)iVar15 == 3) {
              _local_b8 = JS_GetOwnPropertyNames2(ctx,holder,0x11,0);
            }
            else {
              JVar12 = (JSValueUnion)(jsc->property_list).u.ptr;
              JVar19.tag = iVar15;
              JVar19.u.ptr = JVar12.ptr;
              local_b0 = (JSValueUnion)iVar15;
              local_b8.ptr = JVar12.ptr;
              if (0xfffffff4 < (uint)iVar15) {
                *(int *)JVar12.ptr = *JVar12.ptr + 1;
                _local_b8 = JVar19;
              }
            }
            JVar21.tag = (int64_t)local_b8.ptr;
            JVar21.u.float64 = local_b0.float64;
            if (local_b8._8_4_ == 6) break;
            JVar12 = local_b0;
            JVar20 = _local_b8;
            iVar7 = js_get_length64(ctx,(int64_t *)&local_50,_local_b8);
            if (iVar7 == 0) {
              string_buffer_putc8(jsc->b,0x7b);
              local_94 = 0x7d;
              if (0 < (long)local_50) {
                local_38 = (void *)((long)local_50 + -1);
                bVar6 = true;
                JVar12.float64 = 0.0;
                do {
                  while( true ) {
                    JVar10 = JVar12;
                    if (0xfffffff4 < local_90._8_4_) {
                      iVar7 = *local_90.ptr;
                      *(int *)local_90.ptr = iVar7 + -1;
                      if (iVar7 < 2) {
                        __JS_FreeValueRT(ctx->rt,_local_90);
                      }
                    }
                    JVar19 = JS_GetPropertyInt64(ctx,_local_b8,(int64_t)JVar10);
                    JVar12 = JVar19.u;
                    _local_90 = JVar19;
                    if ((uint)JVar19.tag == 6) goto LAB_0012d992;
                    if (0xfffffff4 < (uint)JVar19.tag) {
                      *(int *)JVar12.ptr = *JVar12.ptr + 1;
                    }
                    JVar20 = JS_GetPropertyValue(ctx,holder,JVar19);
                    if ((int)JVar20.tag == 6) goto LAB_0012d992;
                    iStack_88 = JVar19.tag;
                    JVar20 = js_json_check(ctx,jsc,holder,JVar20,JVar19);
                    uVar8 = (uint)JVar20.tag;
                    if (uVar8 != 3) break;
                    JVar12.float64 = JVar10.float64 + 1;
                    if (local_50 == JVar12.ptr) {
                      JVar20 = _local_b8;
                      JVar22 = JVar21;
                      if (bVar6) goto LAB_0012d93b;
                      goto LAB_0012d8e6;
                    }
                  }
                  if (uVar8 == 6) goto LAB_0012d974;
                  if (!bVar6) {
                    string_buffer_putc8(jsc->b,0x2c);
                  }
                  JVar19 = JS_ToQuotedStringFree(ctx,JVar19);
                  _local_90 = JVar19;
                  if ((int)JVar19.tag == 6) {
                    if (uVar8 < 0xfffffff5) goto LAB_0012d974;
                    local_60 = JVar20.u;
                    iVar7 = *local_60.ptr;
                    *(int *)local_60.ptr = iVar7 + -1;
                    if (1 < iVar7) goto LAB_0012d974;
                    __JS_FreeValueRT(ctx->rt,JVar20);
                    goto LAB_0012d992;
                  }
                  string_buffer_concat_value(jsc->b,v);
                  string_buffer_concat_value(jsc->b,JVar19);
                  string_buffer_putc8(jsc->b,0x3a);
                  string_buffer_concat_value(jsc->b,v_00);
                  indent_00.tag = iStack_88;
                  indent_00.u.float64 = JVar12.float64;
                  JVar22 = JVar18;
                  iVar7 = js_json_to_str(ctx,jsc,JVar20,JVar18,indent_00);
                  if (iVar7 != 0) goto LAB_0012d974;
                  bVar6 = false;
                  JVar12.float64 = JVar10.float64 + 1;
                } while (local_38 != JVar10.ptr);
LAB_0012d8e6:
                JVar12.float64 = JVar10.float64 + 1;
                pvVar11 = (jsc->gap).u.ptr;
                local_94 = 0x7d;
LAB_0012d8f2:
                JVar20.tag = (int64_t)JVar22.u.ptr;
                JVar20.u = (JSValueUnion)(JSValueUnion)JVar22.tag;
                if ((*(uint *)((long)pvVar11 + 4) & 0x7fffffff) != 0) goto LAB_0012d918;
              }
              goto LAB_0012d93b;
            }
          }
LAB_0012d992:
        }
        else {
LAB_0012d363:
          _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
        }
      }
      else {
        if (0xfffffff4 < uVar13) {
          *(int *)JVar9.ptr = *JVar9.ptr + 1;
        }
        v = JS_ConcatString3(ctx,"\n",JVar18,"");
        if ((int)v.tag == 6) {
          v_00 = (JSValue)(ZEXT816(3) << 0x40);
          _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
        }
        else {
          v_00 = JS_NewStringLen(ctx," ",1);
          if ((int)v_00.tag != 6) goto LAB_0012d334;
LAB_0012d2da:
          _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
        }
      }
    }
    else {
      JS_ThrowTypeError(ctx,"circular reference");
      JVar18 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0012d235:
      v = (JSValue)(ZEXT816(3) << 0x40);
      v_00 = (JSValue)(ZEXT816(3) << 0x40);
      _local_b8 = (JSValue)(ZEXT816(3) << 0x40);
    }
  }
  if ((0xfffffff4 < (uint)holder.tag) &&
     (iVar7 = *holder.u.ptr, *(int *)holder.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,holder);
  }
  if ((0xfffffff4 < local_b8._8_4_) &&
     (iVar7 = *local_b8.ptr, *(int *)local_b8.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,_local_b8);
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar7 = *v.u.ptr, *(int *)v.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,v);
  }
  if ((0xfffffff4 < (uint)v_00.tag) &&
     (iVar7 = *v_00.u.ptr, *(int *)v_00.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  local_a0 = (uint)JVar18.tag;
  if ((0xfffffff4 < local_a0) &&
     (iVar7 = *JVar18.u.ptr, *(int *)JVar18.u.ptr = iVar7 + -1, iVar7 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar18);
  }
  iVar7 = -1;
  if (0xfffffff4 < local_90._8_4_) {
    iVar3 = *local_90.ptr;
    *(int *)local_90.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      rt = ctx->rt;
      holder = _local_90;
LAB_0012d137:
      __JS_FreeValueRT(rt,holder);
    }
  }
  return iVar7;
}

Assistant:

static int js_json_to_str(JSContext *ctx, JSONStringifyContext *jsc,
                          JSValueConst holder, JSValue val,
                          JSValueConst indent)
{
    JSValue indent1, sep, sep1, tab, v, prop;
    JSObject *p;
    int64_t i, len;
    int cl, ret;
    BOOL has_content;
    
    indent1 = JS_UNDEFINED;
    sep = JS_UNDEFINED;
    sep1 = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    prop = JS_UNDEFINED;

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        p = JS_VALUE_GET_OBJ(val);
        cl = p->class_id;
        if (cl == JS_CLASS_STRING) {
            val = JS_ToStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            val = JS_ToQuotedStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_NUMBER) {
            val = JS_ToNumberFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BOOLEAN) {
            ret = string_buffer_concat_value(jsc->b, p->u.object_data);
            JS_FreeValue(ctx, val);
            return ret;
        }
#ifdef CONFIG_BIGNUM
        else if (cl == JS_CLASS_BIG_FLOAT) {
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BIG_INT) {
            JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
            goto exception;
        }
#endif
        v = js_array_includes(ctx, jsc->stack, 1, (JSValueConst *)&val);
        if (JS_IsException(v))
            goto exception;
        if (JS_ToBoolFree(ctx, v)) {
            JS_ThrowTypeError(ctx, "circular reference");
            goto exception;
        }
        indent1 = JS_ConcatString(ctx, JS_DupValue(ctx, indent), JS_DupValue(ctx, jsc->gap));
        if (JS_IsException(indent1))
            goto exception;
        if (!JS_IsEmptyString(jsc->gap)) {
            sep = JS_ConcatString3(ctx, "\n", JS_DupValue(ctx, indent1), "");
            if (JS_IsException(sep))
                goto exception;
            sep1 = JS_NewString(ctx, " ");
            if (JS_IsException(sep1))
                goto exception;
        } else {
            sep = JS_DupValue(ctx, jsc->empty);
            sep1 = JS_DupValue(ctx, jsc->empty);
        }
        v = js_array_push(ctx, jsc->stack, 1, (JSValueConst *)&val, 0);
        if (check_exception_free(ctx, v))
            goto exception;
        ret = JS_IsArray(ctx, val);
        if (ret < 0)
            goto exception;
        if (ret) {
            if (js_get_length64(ctx, &len, val))
                goto exception;
            string_buffer_putc8(jsc->b, '[');
            for(i = 0; i < len; i++) {
                if (i > 0)
                    string_buffer_putc8(jsc->b, ',');
                string_buffer_concat_value(jsc->b, sep);
                v = JS_GetPropertyInt64(ctx, val, i);
                if (JS_IsException(v))
                    goto exception;
                /* XXX: could do this string conversion only when needed */
                prop = JS_ToStringFree(ctx, JS_NewInt64(ctx, i));
                if (JS_IsException(prop))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                JS_FreeValue(ctx, prop);
                prop = JS_UNDEFINED;
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsUndefined(v))
                    v = JS_NULL;
                if (js_json_to_str(ctx, jsc, val, v, indent1))
                    goto exception;
            }
            if (len > 0 && !JS_IsEmptyString(jsc->gap)) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, ']');
        } else {
            if (!JS_IsUndefined(jsc->property_list))
                tab = JS_DupValue(ctx, jsc->property_list);
            else
                tab = js_object_keys(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val, JS_ITERATOR_KIND_KEY);
            if (JS_IsException(tab))
                goto exception;
            if (js_get_length64(ctx, &len, tab))
                goto exception;
            string_buffer_putc8(jsc->b, '{');
            has_content = FALSE;
            for(i = 0; i < len; i++) {
                JS_FreeValue(ctx, prop);
                prop = JS_GetPropertyInt64(ctx, tab, i);
                if (JS_IsException(prop))
                    goto exception;
                v = JS_GetPropertyValue(ctx, val, JS_DupValue(ctx, prop));
                if (JS_IsException(v))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                if (JS_IsException(v))
                    goto exception;
                if (!JS_IsUndefined(v)) {
                    if (has_content)
                        string_buffer_putc8(jsc->b, ',');
                    prop = JS_ToQuotedStringFree(ctx, prop);
                    if (JS_IsException(prop)) {
                        JS_FreeValue(ctx, v);
                        goto exception;
                    }
                    string_buffer_concat_value(jsc->b, sep);
                    string_buffer_concat_value(jsc->b, prop);
                    string_buffer_putc8(jsc->b, ':');
                    string_buffer_concat_value(jsc->b, sep1);
                    if (js_json_to_str(ctx, jsc, val, v, indent1))
                        goto exception;
                    has_content = TRUE;
                }
            }
            if (has_content && JS_VALUE_GET_STRING(jsc->gap)->len != 0) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, '}');
        }
        if (check_exception_free(ctx, js_array_pop(ctx, jsc->stack, 0, NULL, 0)))
            goto exception;
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, tab);
        JS_FreeValue(ctx, sep);
        JS_FreeValue(ctx, sep1);
        JS_FreeValue(ctx, indent1);
        JS_FreeValue(ctx, prop);
        return 0;
    case JS_TAG_STRING:
        val = JS_ToQuotedStringFree(ctx, val);
        if (JS_IsException(val))
            goto exception;
        goto concat_value;
    case JS_TAG_FLOAT64:
        if (!isfinite(JS_VALUE_GET_FLOAT64(val))) {
            val = JS_NULL;
        }
        goto concat_value;
    case JS_TAG_INT:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    concat_value:
        return string_buffer_concat_value_free(jsc->b, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
        goto exception;
#endif
    default:
        JS_FreeValue(ctx, val);
        return 0;
    }
    
exception:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, sep1);
    JS_FreeValue(ctx, indent1);
    JS_FreeValue(ctx, prop);
    return -1;
}